

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O1

int omac_acpkm_imit_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  long *plVar11;
  CMAC_ACPKM_CTX *pCVar12;
  
  plVar10 = (long *)EVP_MD_CTX_get0_md_data();
  plVar11 = (long *)EVP_MD_CTX_get0_md_data(from);
  iVar8 = 0;
  iVar9 = 0;
  if (plVar10 != (long *)0x0 && plVar11 != (long *)0x0) {
    plVar10[1] = plVar11[1];
    plVar10[2] = plVar11[2];
    *(int *)(plVar10 + 3) = (int)plVar11[3];
    pCVar12 = (CMAC_ACPKM_CTX *)*plVar10;
    if ((CMAC_ACPKM_CTX *)*plVar11 == (CMAC_ACPKM_CTX *)0x0) {
      iVar9 = 1;
      if (pCVar12 != (CMAC_ACPKM_CTX *)0x0) {
        CMAC_ACPKM_CTX_free(pCVar12);
        *plVar10 = 0;
      }
    }
    else {
      if (pCVar12 == (CMAC_ACPKM_CTX *)*plVar11 || pCVar12 == (CMAC_ACPKM_CTX *)0x0) {
        pCVar12 = CMAC_ACPKM_CTX_new();
        *plVar10 = (long)pCVar12;
      }
      puVar1 = (undefined8 *)*plVar10;
      iVar9 = iVar8;
      if ((puVar1 != (undefined8 *)0x0) &&
         (puVar2 = (undefined8 *)*plVar11, *(int *)(puVar2 + 0x10) != -1)) {
        iVar8 = EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)*puVar1,(EVP_CIPHER_CTX *)*puVar2);
        if (iVar8 != 0) {
          iVar8 = EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)puVar1[1],(EVP_CIPHER_CTX *)puVar2[1]);
          if (iVar8 != 0) {
            iVar9 = EVP_CIPHER_CTX_get_block_size(*puVar2);
            uVar3 = puVar2[3];
            uVar4 = puVar2[4];
            uVar5 = puVar2[5];
            uVar6 = puVar2[6];
            uVar7 = puVar2[7];
            puVar1[2] = puVar2[2];
            puVar1[3] = uVar3;
            puVar1[4] = uVar4;
            puVar1[5] = uVar5;
            puVar1[6] = uVar6;
            puVar1[7] = uVar7;
            memcpy(puVar1 + 8,puVar2 + 8,(long)iVar9);
            memcpy(puVar1 + 0xc,puVar2 + 0xc,(long)iVar9);
            puVar1[0x10] = puVar2[0x10];
            *(undefined4 *)(puVar1 + 0x11) = *(undefined4 *)(puVar2 + 0x11);
            iVar9 = 1;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

static int omac_acpkm_imit_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    OMAC_ACPKM_CTX *c_to = EVP_MD_CTX_md_data(to);
    const OMAC_ACPKM_CTX *c_from = EVP_MD_CTX_md_data(from);

    if (c_from && c_to) {
        c_to->dgst_size = c_from->dgst_size;
        c_to->cipher_name = c_from->cipher_name;
        c_to->key_set = c_from->key_set;
    } else {
        return 0;
    }
    if (!c_from->cmac_ctx) {
        if (c_to->cmac_ctx) {
            CMAC_ACPKM_CTX_free(c_to->cmac_ctx);
            c_to->cmac_ctx = NULL;
        }
        return 1;
    }
    if ((c_to->cmac_ctx == c_from->cmac_ctx) || (c_to->cmac_ctx == NULL))  {
        c_to->cmac_ctx = CMAC_ACPKM_CTX_new();
    }

    return (c_to->cmac_ctx) ? CMAC_ACPKM_CTX_copy(c_to->cmac_ctx, c_from->cmac_ctx) : 0;
}